

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.h
# Opt level: O0

basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
google::protobuf::Arena::Create<std::__cxx11::string,char_const*,unsigned_long>
          (Arena *arena,char **args,unsigned_long *args_1)

{
  char *pcVar1;
  ulong uVar2;
  string *psVar3;
  allocator local_3e;
  undefined1 local_3d;
  allocator local_29;
  ulong *local_28;
  unsigned_long *args_local_1;
  char **args_local;
  Arena *arena_local;
  
  local_28 = args_1;
  args_local_1 = (unsigned_long *)args;
  args_local = (char **)arena;
  if (arena == (Arena *)0x0) {
    psVar3 = (string *)operator_new(0x20);
    local_3d = 1;
    pcVar1 = (char *)*args_local_1;
    uVar2 = *local_28;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(psVar3,pcVar1,uVar2,&local_29);
    local_3d = 0;
    arena_local = (Arena *)psVar3;
    std::allocator<char>::~allocator((allocator<char> *)&local_29);
  }
  else {
    psVar3 = (string *)AllocateInternal<std::__cxx11::string,false>(arena);
    pcVar1 = (char *)*args_local_1;
    uVar2 = *local_28;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(psVar3,pcVar1,uVar2,&local_3e);
    arena_local = (Arena *)psVar3;
    std::allocator<char>::~allocator((allocator<char> *)&local_3e);
  }
  return (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)arena_local;
}

Assistant:

PROTOBUF_NDEBUG_INLINE static T* PROTOBUF_NONNULL
  Create(Arena* PROTOBUF_NULLABLE arena, Args&&... args) {
    if constexpr (is_arena_constructable<T>::value) {
      using Type = std::remove_const_t<T>;
      // DefaultConstruct/CopyConstruct are optimized for messages, which
      // are both arena constructible and destructor skippable and they
      // assume much. Don't use these functions unless the invariants
      // hold.
      if constexpr (is_destructor_skippable<T>::value) {
        constexpr auto construct_type = GetConstructType<T, Args&&...>();
        // We delegate to DefaultConstruct/CopyConstruct where appropriate
        // because protobuf generated classes have external templates for
        // these functions for code size reasons. When `if constexpr` is not
        // available always use the fallback.
        if constexpr (construct_type == ConstructType::kDefault) {
          return static_cast<Type*>(DefaultConstruct<Type>(arena));
        } else if constexpr (construct_type == ConstructType::kCopy) {
          return static_cast<Type*>(CopyConstruct<Type>(arena, &args...));
        }
      }
      return CreateArenaCompatible<Type>(arena, std::forward<Args>(args)...);
    } else {
      if (ABSL_PREDICT_FALSE(arena == nullptr)) {
        return new T(std::forward<Args>(args)...);
      }
      return new (arena->AllocateInternal<T>()) T(std::forward<Args>(args)...);
    }
  }